

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.hpp
# Opt level: O3

void __thiscall
de::AppendList<vk::DebugReportMessage>::~AppendList(AppendList<vk::DebugReportMessage> *this)

{
  Block *pBVar1;
  DebugReportMessage *pDVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ulong uVar5;
  Block *pBVar6;
  ulong uVar7;
  
  if (this->m_first != (Block *)0x0) {
    uVar7 = 0;
    pBVar6 = this->m_first;
    do {
      pBVar1 = pBVar6->next;
      while( true ) {
        uVar5 = (pBVar6->blockNdx + 1) * this->m_blockSize;
        if (this->m_numElements < uVar5) {
          uVar5 = this->m_numElements;
        }
        if (uVar5 <= uVar7) break;
        pDVar2 = pBVar6->elements;
        uVar5 = uVar7 % this->m_blockSize;
        paVar4 = &pDVar2[uVar5].message.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(&paVar4->_M_allocated_capacity)[-2] != paVar4) {
          operator_delete((undefined1 *)(&paVar4->_M_allocated_capacity)[-2],
                          paVar4->_M_allocated_capacity + 1);
        }
        pcVar3 = pDVar2[uVar5].layerPrefix._M_dataplus._M_p;
        paVar4 = &pDVar2[uVar5].layerPrefix.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar4) {
          operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
        }
        uVar7 = uVar7 + 1;
      }
      deAlignedFree(pBVar6->elements);
      operator_delete(pBVar6,0x18);
      pBVar6 = pBVar1;
    } while (pBVar1 != (Block *)0x0);
  }
  return;
}

Assistant:

AppendList<ElementType>::~AppendList (void)
{
	size_t	elementNdx	= 0;
	Block*	curBlock	= m_first;

	while (curBlock)
	{
		Block* const	delBlock	= curBlock;

		curBlock = delBlock->next;

		// Call destructor for allocated elements
		for (; elementNdx < min(m_numElements, (delBlock->blockNdx+1)*m_blockSize); ++elementNdx)
			delBlock->elements[elementNdx%m_blockSize].~ElementType();

		delete delBlock;
	}

	DE_ASSERT(elementNdx == m_numElements);
}